

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall PolymerWrapper::PolymerWrapper(PolymerWrapper *this,Ptr *polymer)

{
  element_type *peVar1;
  Ptr *polymer_local;
  PolymerWrapper *this_local;
  
  Reaction::Reaction(&this->super_Reaction);
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_002aa9a0;
  std::shared_ptr<Polymer>::shared_ptr(&this->polymer_,polymer);
  (this->super_Reaction).old_prop_ = 0.0;
  peVar1 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->polymer_);
  (**peVar1->_vptr_Polymer)();
  return;
}

Assistant:

PolymerWrapper::PolymerWrapper(Polymer::Ptr polymer) : polymer_(polymer) {
  old_prop_ = 0;
  polymer_->Initialize();
}